

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IOCommunicationsNode::Decode(IOCommunicationsNode *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (5 < KVar1) {
    StandardVariable::Decode(&this->super_StandardVariable,stream);
    KDataStream::Read(stream,&(this->super_StandardVariable).field_0xe);
    KDataStream::Read(stream,&(this->super_StandardVariable).field_0xf);
    (*(this->m_CommID).super_EntityIdentifier.super_SimulationIdentifier.super_DataTypeBase.
      _vptr_DataTypeBase[3])(&this->m_CommID,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IOCommunicationsNode::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < STANDARD_VARIABLE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    StandardVariable::Decode( stream );

    stream >> m_ui8CommNodeTyp
           >> m_ui8Padding
           >> KDIS_STREAM m_CommID;
}